

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int string_buffer_putc16(StringBuffer *s,uint32_t c)

{
  int iVar1;
  uint in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RDI + 0x10) < *(int *)(in_RDI + 0x14)) {
    if (*(int *)(in_RDI + 0x18) != 0) {
      iVar1 = *(int *)(in_RDI + 0x10);
      *(int *)(in_RDI + 0x10) = iVar1 + 1;
      *(short *)(*(long *)(in_RDI + 8) + 0x10 + (long)iVar1 * 2) = (short)in_ESI;
      return 0;
    }
    if (in_ESI < 0x100) {
      iVar1 = *(int *)(in_RDI + 0x10);
      *(int *)(in_RDI + 0x10) = iVar1 + 1;
      *(char *)(*(long *)(in_RDI + 8) + 0x10 + (long)iVar1) = (char)in_ESI;
      return 0;
    }
  }
  iVar1 = string_buffer_putc_slow((StringBuffer *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),0);
  return iVar1;
}

Assistant:

static int string_buffer_putc16(StringBuffer *s, uint32_t c)
{
    if (likely(s->len < s->size)) {
        if (s->is_wide_char) {
            s->str->u.str16[s->len++] = c;
            return 0;
        } else if (c < 0x100) {
            s->str->u.str8[s->len++] = c;
            return 0;
        }
    }
    return string_buffer_putc_slow(s, c);
}